

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

SrcList_item * isSelfJoinView(SrcList *pTabList,SrcList_item *pThis)

{
  long lVar1;
  char *zLeft;
  char *zRight;
  int iVar2;
  byte *pbVar3;
  SrcList_item *pSVar4;
  
  if (pTabList->a < pThis) {
    pbVar3 = &pTabList->a[0].fg.field_0x1;
    do {
      lVar1 = *(long *)(pbVar3 + -0x15);
      if (((lVar1 != 0) && ((*pbVar3 & 0x10) == 0)) &&
         (zLeft = *(char **)(pbVar3 + -0x2d), zLeft != (char *)0x0)) {
        zRight = pThis->zDatabase;
        if (*(char **)(pbVar3 + -0x35) == (char *)0x0) {
          iVar2 = -(uint)(zRight != (char *)0x0);
        }
        else if (zRight == (char *)0x0) {
          iVar2 = 1;
        }
        else {
          iVar2 = sqlite3StrICmp(*(char **)(pbVar3 + -0x35),zRight);
        }
        if (((iVar2 == 0) && (pThis->zName != (char *)0x0)) &&
           ((iVar2 = sqlite3StrICmp(zLeft,pThis->zName), iVar2 == 0 &&
            (iVar2 = sqlite3ExprCompare((Parse *)0x0,pThis->pSelect->pWhere,*(Expr **)(lVar1 + 0x30)
                                        ,-1), iVar2 == 0)))) {
          return (SrcList_item *)(pbVar3 + -0x3d);
        }
      }
      pSVar4 = (SrcList_item *)(pbVar3 + 0x33);
      pbVar3 = pbVar3 + 0x70;
    } while (pSVar4 < pThis);
  }
  return (SrcList_item *)0x0;
}

Assistant:

static struct SrcList_item *isSelfJoinView(
  SrcList *pTabList,           /* Search for self-joins in this FROM clause */
  struct SrcList_item *pThis   /* Search for prior reference to this subquery */
){
  struct SrcList_item *pItem;
  for(pItem = pTabList->a; pItem<pThis; pItem++){
    if( pItem->pSelect==0 ) continue;
    if( pItem->fg.viaCoroutine ) continue;
    if( pItem->zName==0 ) continue;
    if( sqlite3_stricmp(pItem->zDatabase, pThis->zDatabase)!=0 ) continue;
    if( sqlite3_stricmp(pItem->zName, pThis->zName)!=0 ) continue;
    if( sqlite3ExprCompare(0, 
          pThis->pSelect->pWhere, pItem->pSelect->pWhere, -1) 
    ){
      /* The view was modified by some other optimization such as
      ** pushDownWhereTerms() */
      continue;
    }
    return pItem;
  }
  return 0;
}